

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O3

bool duckdb::TrySimpleIntegerCast<signed_char,true>(char *buf,idx_t len,char *result,bool strict)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  byte bVar4;
  byte bVar5;
  char *pcVar6;
  ulong uVar7;
  ushort uVar8;
  duckdb *pdVar9;
  ulong uVar10;
  byte bVar11;
  byte bVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  int16_t local_5a;
  IntegerDecimalCastData<signed_char> local_58;
  ulong local_40;
  ulong local_38;
  
  if (len == 0) {
    return false;
  }
  uVar2 = 0;
  do {
    bVar4 = buf[uVar2];
    if ((4 < bVar4 - 9) && (bVar4 != 0x20)) {
      if (bVar4 == 0x2d) {
        if (len - 1 != uVar2) {
          uVar10 = len - uVar2;
          uVar13 = 1;
          bVar4 = 0;
          goto LAB_014ef5aa;
        }
        break;
      }
      if (bVar4 == 0x30 && len - 1 != uVar2) {
        bVar12 = buf[uVar2 + 1];
        if (bVar12 < 0x62) {
          if (bVar12 == 0x42) {
LAB_014ef875:
            uVar10 = ~uVar2 + len;
            if (1 < uVar10) {
              uVar13 = 1;
              bVar4 = 0;
              goto LAB_014ef890;
            }
            break;
          }
          if (bVar12 == 0x58) {
LAB_014ef752:
            uVar10 = ~uVar2 + len;
            if (1 < uVar10) {
              uVar13 = 1;
              bVar4 = 0;
              goto LAB_014ef778;
            }
            break;
          }
        }
        else {
          if (bVar12 == 0x62) goto LAB_014ef875;
          if (bVar12 == 0x78) goto LAB_014ef752;
        }
      }
      uVar13 = len - uVar2;
      uVar10 = (ulong)(bVar4 == 0x2b);
      if (uVar13 <= uVar10) {
        bVar4 = 0;
        uVar18 = 1;
        goto LAB_014efa06;
      }
      bVar4 = 0;
      uVar7 = uVar10;
      goto LAB_014ef69a;
    }
    uVar2 = uVar2 + 1;
  } while (len != uVar2);
  goto LAB_014efa43;
  while( true ) {
    bVar11 = (byte)(0xb0 - bVar12) / 10;
    if (SBORROW1(bVar4,-bVar11) != (char)(bVar4 + bVar11) < '\0') goto LAB_014efa43;
    bVar4 = (bVar4 * '\n' - bVar12) + 0x30;
    uVar18 = uVar10;
    if (~uVar13 + len == uVar2) break;
    if (buf[uVar2 + 1 + uVar13] == '_') {
      if (((len - uVar13) - 2 == uVar2) ||
         (uVar13 = uVar13 + 2, 9 < (byte)(buf[uVar2 + uVar13] - 0x30U))) goto LAB_014efa43;
    }
    else {
      uVar13 = uVar13 + 1;
    }
    uVar18 = uVar13;
    if (uVar10 <= uVar13) break;
LAB_014ef5aa:
    bVar12 = buf[uVar2 + uVar13];
    if (9 < (byte)(bVar12 - 0x30)) {
      uVar7 = uVar13;
      if (bVar12 == 0x2e) {
        uVar7 = uVar13 + 1;
        uVar18 = uVar13;
        if (uVar10 <= uVar7) break;
        if ((uVar13 < 2) || (bVar12 = buf[uVar2 + 1 + uVar13], (byte)(bVar12 - 0x30) < 10))
        goto LAB_014efa43;
      }
      if ((4 < bVar12 - 9) && (bVar12 != 0x20)) goto LAB_014efa43;
      uVar7 = uVar7 + 1;
      uVar18 = uVar7;
      if (uVar7 < uVar10) goto LAB_014ef964;
      break;
    }
  }
  goto joined_r0x014efa1e;
  while (uVar7 = uVar7 + 1, uVar18 = uVar10, uVar10 != uVar7) {
LAB_014ef964:
    if ((4 < (byte)buf[uVar2 + uVar7] - 9) && (buf[uVar2 + uVar7] != 0x20)) goto LAB_014efa43;
  }
joined_r0x014efa1e:
  if (1 < uVar18) goto LAB_014efa0b;
  goto LAB_014efa43;
  while( true ) {
    uVar7 = uVar10;
    if ((len - uVar13) - 2 != uVar2) {
      if (buf[uVar2 + 2 + uVar13] == '_') {
        if (((len - uVar13) - 3 == uVar2) || ((buf[uVar2 + 3 + uVar13] & 0xfeU) != 0x30))
        goto LAB_014efa43;
        uVar7 = uVar13 + 2;
      }
      else {
        uVar7 = uVar13 + 1;
      }
    }
    uVar13 = uVar7;
    if ('?' < (char)bVar4) goto LAB_014efa43;
    bVar4 = bVar4 * '\x02' | bVar12;
    if (uVar10 <= uVar13) break;
LAB_014ef890:
    if (buf[uVar2 + 1 + uVar13] == '0') {
      bVar12 = 0;
    }
    else {
      if (buf[uVar2 + 1 + uVar13] != '1') goto LAB_014efa43;
      bVar12 = 1;
    }
  }
  goto LAB_014efa0b;
  while( true ) {
    uVar13 = uVar7;
    if ((char)(((byte)((char)bVar5 >> 7) >> 4) + (bVar5 ^ 0x7f)) >> 4 < (char)bVar4)
    goto LAB_014efa43;
    bVar4 = bVar5 + bVar4 * '\x10';
    if (uVar10 <= uVar13) break;
LAB_014ef778:
    bVar12 = buf[uVar2 + 1 + uVar13];
    bVar11 = bVar12 | 0x20;
    if (0x19 < (byte)(bVar12 + 0xbf)) {
      bVar11 = bVar12;
    }
    bVar12 = bVar11 - 0x30;
    if ((byte)(bVar11 + 0x9f) < 6 || bVar12 < 10) {
      bVar5 = bVar11 + 0xa9;
      if (bVar11 < 0x61) {
        bVar5 = bVar12;
      }
    }
    else {
      bVar5 = bVar12;
      if (5 < (byte)(bVar11 + 0xbf)) goto LAB_014efa43;
    }
    uVar7 = uVar10;
    if ((len - uVar13) - 2 != uVar2) {
      if (buf[uVar2 + 2 + uVar13] == '_') {
        if ((len - uVar13) - 3 == uVar2) goto LAB_014efa43;
        uVar7 = uVar13 + 2;
        if ((9 < (byte)(buf[uVar2 + 3 + uVar13] - 0x30U)) &&
           ((uVar14 = (byte)buf[uVar2 + 3 + uVar13] - 0x41, 0x25 < uVar14 ||
            ((0x3f0000003fU >> ((ulong)uVar14 & 0x3f) & 1) == 0)))) goto LAB_014efa43;
      }
      else {
        uVar7 = uVar13 + 1;
      }
    }
  }
  goto LAB_014efa0b;
  while( true ) {
    if ((char)((byte)(0xaf - bVar12) / 10) < (char)bVar4) goto LAB_014efa43;
    bVar4 = (bVar12 - 0x30) + bVar4 * '\n';
    uVar18 = uVar13;
    if (~uVar7 + len == uVar2) break;
    if (buf[uVar2 + 1 + uVar7] == '_') {
      if (((len - uVar7) - 2 == uVar2) ||
         (uVar7 = uVar7 + 2, 9 < (byte)(buf[uVar2 + uVar7] - 0x30U))) goto LAB_014efa43;
    }
    else {
      uVar7 = uVar7 + 1;
    }
    uVar18 = uVar7;
    if (uVar13 <= uVar7) break;
LAB_014ef69a:
    bVar12 = buf[uVar2 + uVar7];
    if (9 < (byte)(bVar12 - 0x30)) {
      uVar18 = uVar7;
      if (bVar12 == 0x2e) {
        uVar18 = uVar7 + 1;
        if (uVar13 <= uVar18) {
          if (uVar7 <= uVar10) goto LAB_014efa43;
          break;
        }
        if ((uVar7 <= uVar10) || (bVar12 = buf[uVar2 + 1 + uVar7], (byte)(bVar12 - 0x30) < 10))
        goto LAB_014efa43;
      }
      if ((4 < bVar12 - 9) && (bVar12 != 0x20)) goto LAB_014efa43;
      uVar7 = uVar18 + 1;
      uVar18 = uVar7;
      if (uVar7 < uVar13) goto LAB_014ef9de;
      break;
    }
  }
  goto LAB_014efa06;
LAB_014efe60:
  bVar4 = buf[uVar2 + uVar7];
  bVar12 = bVar4 - 0x30;
  local_40 = uVar18;
  if (9 < bVar12) {
    local_58._18_6_ = 0;
    if (uVar7 <= uVar18 && uVar13 < 2) {
      return false;
    }
LAB_014f006f:
    uVar14 = (uint)bVar4;
    if (bVar4 < 0x20) {
      if (4 < uVar14 - 9) {
        return false;
      }
LAB_014f0085:
      uVar7 = uVar7 + 1;
      uVar17 = uVar7;
      if (uVar7 < uVar10) {
        do {
          if ((4 < (byte)buf[uVar2 + uVar7] - 9) && (buf[uVar2 + uVar7] != 0x20)) {
            return false;
          }
          uVar7 = uVar7 + 1;
          uVar17 = uVar10;
        } while (uVar10 != uVar7);
      }
      goto LAB_014eff00;
    }
    if ((bVar4 != 0x65) && (uVar14 != 0x45)) {
      if (uVar14 != 0x20) {
        return false;
      }
      goto LAB_014f0085;
    }
    if (uVar7 == 1) {
      return false;
    }
    if (uVar10 <= uVar7 + 1) {
      return false;
    }
    local_5a = 0;
    pdVar9 = (duckdb *)(buf + uVar2 + uVar7 + 1);
    pcVar6 = (char *)(~uVar2 + (len - uVar7));
    if (*pdVar9 == (duckdb)0x2d) {
      bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                        (pdVar9,pcVar6,(idx_t)&local_5a,(IntegerCastData<short> *)pcVar6,bVar1);
    }
    else {
      bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                        (pdVar9,pcVar6,(idx_t)&local_5a,(IntegerCastData<short> *)pcVar6,bVar1);
    }
    if (bVar1 == false) {
      return false;
    }
    bVar1 = IntegerDecimalCastOperation::
            HandleExponent<duckdb::IntegerDecimalCastData<signed_char>,true>(&local_58,local_5a);
    goto LAB_014efe0c;
  }
  if (local_58.decimal <= (long)(((ulong)bVar12 ^ 0x7ffffffffffffffe) / 10)) {
    local_58.decimal_digits = uVar8 + 1;
    local_58.decimal = (ulong)bVar12 + local_58.decimal * 10;
    uVar8 = local_58.decimal_digits;
  }
  uVar17 = uVar10;
  if (~uVar7 + len != uVar2) goto code_r0x014efeb3;
  goto LAB_014f011f;
code_r0x014efeb3:
  if (buf[uVar2 + 1 + uVar7] == '_') {
    if ((len - uVar7) - 2 == uVar2) {
      return false;
    }
    uVar7 = uVar7 + 2;
    if (9 < (byte)(buf[uVar2 + uVar7] - 0x30U)) {
      return false;
    }
  }
  else {
    uVar7 = uVar7 + 1;
  }
  uVar17 = uVar7;
  if (uVar10 <= uVar7) goto LAB_014f011f;
  goto LAB_014efe60;
LAB_014f011f:
  local_58._18_6_ = 0;
LAB_014f012f:
  if ((uVar13 < 2) && (uVar17 <= uVar18)) {
    return false;
  }
  goto LAB_014eff00;
LAB_014eff55:
  uVar15 = uVar16;
  bVar4 = buf[uVar2 + uVar18];
  bVar12 = bVar4 - 0x30;
  local_38 = uVar17;
  if (9 < bVar12) {
    local_58._16_8_ = uVar15 & 0xffff;
    if (uVar18 <= uVar17 && uVar7 <= uVar13) {
      return false;
    }
LAB_014f016a:
    uVar14 = (uint)bVar4;
    if (0x1f < bVar4) {
      if ((bVar4 != 0x65) && (uVar14 != 0x45)) {
        if (uVar14 != 0x20) {
          return false;
        }
        goto LAB_014f0180;
      }
      if (uVar18 == uVar13) {
        return false;
      }
      if (uVar10 <= uVar18 + 1) {
        return false;
      }
      local_5a = 0;
      pdVar9 = (duckdb *)(buf + uVar2 + uVar18 + 1);
      pcVar6 = (char *)(~uVar2 + (len - uVar18));
      if (*pdVar9 == (duckdb)0x2d) {
        bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                          (pdVar9,pcVar6,(idx_t)&local_5a,(IntegerCastData<short> *)pcVar6,bVar1);
      }
      else {
        bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                          (pdVar9,pcVar6,(idx_t)&local_5a,(IntegerCastData<short> *)pcVar6,bVar1);
      }
      if (bVar1 == false) {
        return false;
      }
      bVar1 = IntegerDecimalCastOperation::
              HandleExponent<duckdb::IntegerDecimalCastData<signed_char>,false>(&local_58,local_5a);
      goto LAB_014efe0c;
    }
    if (4 < uVar14 - 9) {
      return false;
    }
LAB_014f0180:
    uVar18 = uVar18 + 1;
    uVar19 = uVar18;
    if (uVar18 < uVar10) {
      do {
        if ((4 < (byte)buf[uVar2 + uVar18] - 9) && (buf[uVar2 + uVar18] != 0x20)) {
          return false;
        }
        uVar18 = uVar18 + 1;
        uVar19 = uVar10;
      } while (uVar10 != uVar18);
    }
    goto LAB_014f001f;
  }
  uVar16 = uVar15;
  if (local_58.decimal <= (long)(((ulong)bVar12 ^ 0x7ffffffffffffffe) / 10)) {
    uVar14 = uVar14 + 1;
    local_58.decimal = local_58.decimal * 10 + (ulong)bVar12;
    uVar16 = (ulong)uVar14;
  }
  uVar19 = uVar10;
  local_40 = uVar15;
  if (~uVar18 + len != uVar2) goto code_r0x014effc3;
  goto LAB_014f0212;
code_r0x014effc3:
  if (buf[uVar2 + 1 + uVar18] == '_') {
    if ((len - uVar18) - 2 == uVar2) {
      return false;
    }
    uVar18 = uVar18 + 2;
    if (9 < (byte)(buf[uVar2 + uVar18] - 0x30U)) {
      return false;
    }
  }
  else {
    uVar18 = uVar18 + 1;
  }
  uVar19 = uVar18;
  if (uVar10 <= uVar18) goto LAB_014f0212;
  goto LAB_014eff55;
LAB_014f0212:
  local_58._16_8_ = uVar16 & 0xffff;
LAB_014f0222:
  if ((uVar7 <= uVar13) && (uVar19 <= uVar17)) {
    return false;
  }
  goto LAB_014f001f;
  while (uVar7 = uVar7 + 1, uVar18 = uVar13, uVar13 != uVar7) {
LAB_014ef9de:
    if ((4 < (byte)buf[uVar2 + uVar7] - 9) && (buf[uVar2 + uVar7] != 0x20)) goto LAB_014efa43;
  }
LAB_014efa06:
  if (uVar10 < uVar18) {
LAB_014efa0b:
    *result = bVar4;
    return true;
  }
LAB_014efa43:
  uVar2 = 0;
  while ((bVar4 = buf[uVar2], bVar4 - 9 < 5 || (bVar4 == 0x20))) {
    uVar2 = uVar2 + 1;
    if (len == uVar2) {
      return false;
    }
  }
  local_58.result = 0;
  local_58.decimal = 0;
  local_58._16_8_ = 0;
  uVar10 = len - uVar2;
  bVar1 = SUB81(uVar10,0);
  if (bVar4 == 0x2d) {
    if (len - 1 == uVar2) {
      IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<signed_char>,true>
                (&local_58);
      return false;
    }
    uVar13 = 1;
    local_58.result = 0;
    do {
      bVar4 = buf[uVar2 + uVar13];
      bVar12 = bVar4 - 0x30;
      if (9 < bVar12) {
        uVar7 = uVar13;
        if (bVar4 != 0x2e) goto LAB_014f006f;
        uVar18 = uVar13 + 1;
        uVar17 = uVar18;
        if (uVar10 <= uVar18) goto LAB_014f012f;
        local_58.decimal = 0;
        local_58.decimal_digits = 0;
        uVar8 = 0;
        uVar7 = uVar18;
        goto LAB_014efe60;
      }
      uVar7 = (0x8000000000000000 - (ulong)bVar12) / 10;
      if (SBORROW8(local_58.result,-uVar7) != (long)(local_58.result + uVar7) < 0) {
        return false;
      }
      local_58.result = local_58.result * 10 - (ulong)bVar12;
      uVar17 = uVar10;
      if (~uVar13 + len == uVar2) break;
      if (buf[uVar2 + 1 + uVar13] == '_') {
        if ((len - uVar13) - 2 == uVar2) {
          return false;
        }
        uVar13 = uVar13 + 2;
        if (9 < (byte)(buf[uVar2 + uVar13] - 0x30U)) {
          return false;
        }
      }
      else {
        uVar13 = uVar13 + 1;
      }
      uVar17 = uVar13;
    } while (uVar13 < uVar10);
LAB_014eff00:
    bVar1 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<signed_char>,true>
                      (&local_58);
    if (!bVar1) {
      return false;
    }
    if (uVar17 < 2) {
      return false;
    }
    goto LAB_014f003e;
  }
  if (bVar4 == 0x30 && len - 1 != uVar2) {
    bVar12 = buf[uVar2 + 1];
    if (bVar12 < 0x62) {
      if (bVar12 == 0x42) {
LAB_014efd6f:
        uVar10 = ~uVar2 + len;
        if (uVar10 < 2) goto LAB_014efe15;
        uVar13 = 1;
        local_58.result = 0;
        do {
          lVar3 = 0;
          if (buf[uVar2 + 1 + uVar13] != '0') {
            if (buf[uVar2 + 1 + uVar13] != '1') {
              return false;
            }
            lVar3 = 1;
          }
          uVar7 = uVar10;
          if ((len - uVar13) - 2 != uVar2) {
            if (buf[uVar2 + 2 + uVar13] == '_') {
              if ((len - uVar13) - 3 == uVar2) {
                return false;
              }
              if ((buf[uVar2 + 3 + uVar13] & 0xfeU) != 0x30) {
                return false;
              }
              uVar7 = uVar13 + 2;
            }
            else {
              uVar7 = uVar13 + 1;
            }
          }
          uVar13 = uVar7;
          if (0x3fffffffffffffff < local_58.result) {
            return false;
          }
          local_58.result = lVar3 + local_58.result * 2;
        } while (uVar13 < uVar10);
      }
      else {
        if (bVar12 != 0x58) goto LAB_014efacf;
LAB_014efc4e:
        uVar10 = ~uVar2 + len;
        if (uVar10 < 2) goto LAB_014efe15;
        uVar13 = 1;
        local_58.result = 0;
        do {
          bVar4 = buf[uVar2 + 1 + uVar13];
          bVar12 = bVar4 | 0x20;
          if (0x19 < (byte)(bVar4 + 0xbf)) {
            bVar12 = bVar4;
          }
          bVar4 = bVar12 - 0x30;
          if ((byte)(bVar12 + 0x9f) < 6 || bVar4 < 10) {
            bVar11 = bVar12 + 0xa9;
            if (bVar12 < 0x61) {
              bVar11 = bVar4;
            }
          }
          else {
            bVar11 = bVar4;
            if (5 < (byte)(bVar12 + 0xbf)) {
              return false;
            }
          }
          uVar7 = uVar10;
          if ((len - uVar13) - 2 != uVar2) {
            if (buf[uVar2 + 2 + uVar13] == '_') {
              if ((len - uVar13) - 3 == uVar2) {
                return false;
              }
              uVar7 = uVar13 + 2;
              if (9 < (byte)(buf[uVar2 + 3 + uVar13] - 0x30U)) {
                uVar14 = (byte)buf[uVar2 + 3 + uVar13] - 0x41;
                if (0x25 < uVar14) {
                  return false;
                }
                if ((0x3f0000003fU >> ((ulong)uVar14 & 0x3f) & 1) == 0) {
                  return false;
                }
              }
            }
            else {
              uVar7 = uVar13 + 1;
            }
          }
          uVar13 = uVar7;
          if ((long)((ulong)(bVar11 >> 4) ^ 0x7ffffffffffffff) < local_58.result) {
            return false;
          }
          local_58.result = local_58.result * 0x10 + (ulong)bVar11;
        } while (uVar13 < uVar10);
      }
      bVar1 = IntegerDecimalCastOperation::
              Finalize<duckdb::IntegerDecimalCastData<signed_char>,false>(&local_58);
LAB_014efe0c:
      if (bVar1 == false) {
        return false;
      }
      goto LAB_014f003e;
    }
    if (bVar12 == 0x62) goto LAB_014efd6f;
    if (bVar12 == 0x78) goto LAB_014efc4e;
  }
LAB_014efacf:
  uVar13 = (ulong)(bVar4 == 0x2b);
  if (uVar10 <= uVar13) {
LAB_014efe15:
    IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<signed_char>,false>
              (&local_58);
    return false;
  }
  local_58.result = 0;
  uVar7 = uVar13;
  do {
    bVar4 = buf[uVar2 + uVar7];
    bVar12 = bVar4 - 0x30;
    if (9 < bVar12) {
      uVar18 = uVar7;
      if (bVar4 != 0x2e) goto LAB_014f016a;
      uVar17 = uVar7 + 1;
      uVar19 = uVar17;
      if (uVar10 <= uVar17) goto LAB_014f0222;
      local_58.decimal = 0;
      uVar14 = 0;
      uVar16 = 0;
      uVar18 = uVar17;
      goto LAB_014eff55;
    }
    if ((long)(((ulong)bVar12 ^ 0x7ffffffffffffffe) / 10) < local_58.result) {
      return false;
    }
    local_58.result = local_58.result * 10 + (ulong)bVar12;
    uVar19 = uVar10;
    if (~uVar7 + len == uVar2) break;
    if (buf[uVar2 + 1 + uVar7] == '_') {
      if ((len - uVar7) - 2 == uVar2) {
        return false;
      }
      uVar7 = uVar7 + 2;
      if (9 < (byte)(buf[uVar2 + uVar7] - 0x30U)) {
        return false;
      }
    }
    else {
      uVar7 = uVar7 + 1;
    }
    uVar19 = uVar7;
  } while (uVar7 < uVar10);
LAB_014f001f:
  bVar1 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<signed_char>,false>
                    (&local_58);
  if (!bVar1) {
    return false;
  }
  if (uVar19 <= uVar13) {
    return false;
  }
LAB_014f003e:
  *result = (char)local_58.result;
  return true;
}

Assistant:

static bool TryIntegerCast(const char *buf, idx_t len, T &result, bool strict) {
	// skip any spaces at the start
	while (len > 0 && StringUtil::CharacterIsSpace(*buf)) {
		buf++;
		len--;
	}
	if (len == 0) {
		return false;
	}
	if (ZERO_INITIALIZE) {
		memset(&result, 0, sizeof(T));
	}
	// if the number is negative, we set the negative flag and skip the negative sign
	if (*buf == '-') {
		if (!IS_SIGNED) {
			// Need to check if its not -0
			idx_t pos = 1;
			while (pos < len) {
				if (buf[pos++] != '0') {
					return false;
				}
			}
		}
		return IntegerCastLoop<T, true, ALLOW_EXPONENT, OP, decimal_separator>(buf, len, result, strict);
	}
	if (len > 1 && *buf == '0') {
		if (buf[1] == 'x' || buf[1] == 'X') {
			// If it starts with 0x or 0X, we parse it as a hex value
			buf++;
			len--;
			return IntegerHexCastLoop<T, false, false, OP>(buf, len, result, strict);
		} else if (buf[1] == 'b' || buf[1] == 'B') {
			// If it starts with 0b or 0B, we parse it as a binary value
			buf++;
			len--;
			return IntegerBinaryCastLoop<T, false, false, OP>(buf, len, result, strict);
		} else if (strict && StringUtil::CharacterIsDigit(buf[1])) {
			// leading zeros are not allowed in strict mode
			return false;
		}
	}
	return IntegerCastLoop<T, false, ALLOW_EXPONENT, OP, decimal_separator>(buf, len, result, strict);
}